

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharItem.cpp
# Opt level: O0

void __thiscall
Hpipe::CharItem::get_possible_paths
          (CharItem *this,Vec<Hpipe::Vec<Hpipe::CharItem_*>_> *paths,
          function<bool_(Hpipe::CharItem_*)> *f)

{
  CharItem *__args;
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  reference ppCVar4;
  undefined1 local_b8 [8];
  Vec<Hpipe::CharItem_*> new_path;
  CharEdge *t;
  iterator __end4;
  iterator __begin4;
  Vec<Hpipe::CharEdge> *__range4;
  CharItem *last;
  Vec<Hpipe::CharItem_*> path;
  Vec<Hpipe::CharItem_*> local_50;
  undefined1 local_38 [8];
  Vec<Hpipe::Vec<Hpipe::CharItem_*>_> front;
  function<bool_(Hpipe::CharItem_*)> *f_local;
  Vec<Hpipe::Vec<Hpipe::CharItem_*>_> *paths_local;
  CharItem *this_local;
  
  front.super_vector<Hpipe::Vec<Hpipe::CharItem_*>,_std::allocator<Hpipe::Vec<Hpipe::CharItem_*>_>_>
  .
  super__Vector_base<Hpipe::Vec<Hpipe::CharItem_*>,_std::allocator<Hpipe::Vec<Hpipe::CharItem_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)f;
  Vec<Hpipe::Vec<Hpipe::CharItem_*>_>::Vec((Vec<Hpipe::Vec<Hpipe::CharItem_*>_> *)local_38);
  Vec<Hpipe::CharItem_*>::Vec(&local_50,this);
  Vec<Hpipe::Vec<Hpipe::CharItem_*>_>::operator<<
            ((Vec<Hpipe::Vec<Hpipe::CharItem_*>_> *)local_38,&local_50);
  Vec<Hpipe::CharItem_*>::~Vec(&local_50);
  while (sVar2 = std::
                 vector<Hpipe::Vec<Hpipe::CharItem_*>,_std::allocator<Hpipe::Vec<Hpipe::CharItem_*>_>_>
                 ::size((vector<Hpipe::Vec<Hpipe::CharItem_*>,_std::allocator<Hpipe::Vec<Hpipe::CharItem_*>_>_>
                         *)local_38), sVar2 != 0) {
    pvVar3 = std::
             vector<Hpipe::Vec<Hpipe::CharItem_*>,_std::allocator<Hpipe::Vec<Hpipe::CharItem_*>_>_>
             ::back((vector<Hpipe::Vec<Hpipe::CharItem_*>,_std::allocator<Hpipe::Vec<Hpipe::CharItem_*>_>_>
                     *)local_38);
    Vec<Hpipe::CharItem_*>::Vec((Vec<Hpipe::CharItem_*> *)&last,pvVar3);
    std::vector<Hpipe::Vec<Hpipe::CharItem_*>,_std::allocator<Hpipe::Vec<Hpipe::CharItem_*>_>_>::
    pop_back((vector<Hpipe::Vec<Hpipe::CharItem_*>,_std::allocator<Hpipe::Vec<Hpipe::CharItem_*>_>_>
              *)local_38);
    ppCVar4 = std::vector<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_>::back
                        ((vector<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_> *)&last);
    __args = *ppCVar4;
    sVar2 = std::vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>::size
                      (&(__args->edges).
                        super_vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>);
    if (sVar2 == 0) {
      Vec<Hpipe::Vec<Hpipe::CharItem_*>_>::operator<<(paths,(Vec<Hpipe::CharItem_*> *)&last);
    }
    else {
      bVar1 = std::function<bool_(Hpipe::CharItem_*)>::operator()(f,__args);
      if (bVar1) {
        __end4 = std::vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>::begin
                           (&(__args->edges).
                             super_vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>);
        t = (CharEdge *)
            std::vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>::end
                      (&(__args->edges).
                        super_vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<Hpipe::CharEdge_*,_std::vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>_>
                                           *)&t), bVar1) {
          new_path.super_vector<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_>.
          super__Vector_base<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               &__gnu_cxx::
                __normal_iterator<Hpipe::CharEdge_*,_std::vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>_>
                ::operator*(&__end4)->item;
          Vec<Hpipe::CharItem_*>::Vec
                    ((Vec<Hpipe::CharItem_*> *)local_b8,(Vec<Hpipe::CharItem_*> *)&last);
          Vec<Hpipe::CharItem_*>::operator<<
                    ((Vec<Hpipe::CharItem_*> *)local_b8,
                     new_path.super_vector<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_>.
                     super__Vector_base<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
          bVar1 = Vec<Hpipe::CharItem_*>::contains
                            ((Vec<Hpipe::CharItem_*> *)&last,
                             new_path.
                             super_vector<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_>.
                             super__Vector_base<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar1) {
            Vec<Hpipe::Vec<Hpipe::CharItem_*>_>::operator<<
                      (paths,(Vec<Hpipe::CharItem_*> *)local_b8);
          }
          else {
            Vec<Hpipe::Vec<Hpipe::CharItem_*>_>::operator<<
                      ((Vec<Hpipe::Vec<Hpipe::CharItem_*>_> *)local_38,
                       (Vec<Hpipe::CharItem_*> *)local_b8);
          }
          Vec<Hpipe::CharItem_*>::~Vec((Vec<Hpipe::CharItem_*> *)local_b8);
          __gnu_cxx::
          __normal_iterator<Hpipe::CharEdge_*,_std::vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>_>
          ::operator++(&__end4);
        }
      }
      else {
        Vec<Hpipe::Vec<Hpipe::CharItem_*>_>::operator<<(paths,(Vec<Hpipe::CharItem_*> *)&last);
      }
    }
    Vec<Hpipe::CharItem_*>::~Vec((Vec<Hpipe::CharItem_*> *)&last);
  }
  Vec<Hpipe::Vec<Hpipe::CharItem_*>_>::~Vec((Vec<Hpipe::Vec<Hpipe::CharItem_*>_> *)local_38);
  return;
}

Assistant:

void CharItem::get_possible_paths( Vec<Vec<CharItem *>> &paths, std::function<bool (CharItem *)> f ) {
    Vec<Vec<CharItem *>> front;
    front << this;
    while ( front.size() ) {
        Vec<CharItem *> path = front.back();
        front.pop_back();

        CharItem *last = path.back();
        if ( last->edges.size() ){
            if ( f( last ) ){
                for( CharEdge &t : last->edges ) {
                    Vec<CharItem *> new_path = path;
                    new_path << t.item;
                    if ( path.contains( t.item ) )
                        paths << new_path;
                    else
                        front << new_path;
                }
            } else
                paths << path;
        } else
            paths << path;
    }
}